

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O3

void __thiscall
divsufsortxx::core::constructSA_from_typeBstar<char*,bitmap::BitmapArray<long>::iterator,long,int>
          (core *this,char *T,iterator SA,long *bucket_A,long *bucket_B,long n,long m,
          int alphabetsize)

{
  core cVar1;
  long lVar2;
  ulong uVar3;
  pos_type pVar4;
  BitmapArray<long> *pBVar5;
  undefined1 *puVar6;
  BitmapArray<long> *pBVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  BitmapArray<long> *local_80;
  
  pVar4 = SA.pos_;
  pBVar5 = SA.array_;
  if (1 < (int)m && 0 < n) {
    uVar12 = (ulong)((int)m - 2);
    local_80 = pBVar5;
    do {
      lVar2 = uVar12 * (m & 0xffffffffU);
      puVar9 = (undefined1 *)
               ((long)&(pBVar5->super_Bitmap)._vptr_Bitmap + bucket_A[lVar2 + uVar12 + 1]);
      lVar14 = *(long *)(pVar4 + 8 + uVar12 * 8);
      if (puVar9 < (undefined1 *)((long)&(pBVar5->super_Bitmap)._vptr_Bitmap + lVar14 + 1)) {
        uVar10 = 0xffffffff;
        puVar6 = (undefined1 *)((long)&(pBVar5->super_Bitmap)._vptr_Bitmap + lVar14);
        do {
          uVar3 = (**(code **)(*(long *)T + 0x28))(T,puVar6);
          if ((long)uVar3 < 0) {
            uVar11 = ~uVar3;
            lVar14 = *(long *)T;
            puVar8 = puVar6;
LAB_0010574b:
            (**(code **)(lVar14 + 0x20))(T,puVar8,uVar11);
LAB_0010574e:
            uVar13 = (ulong)uVar10;
          }
          else {
            if (uVar3 == 0) goto LAB_0010574e;
            cVar1 = this[uVar3 - 1];
            uVar13 = (ulong)(char)cVar1;
            if ((long)uVar12 < (long)uVar13) goto LAB_0010574e;
            (**(code **)(*(long *)T + 0x20))(T,puVar6,~uVar3);
            if (uVar3 == 1) {
              uVar11 = 0;
            }
            else {
              uVar11 = uVar3 - 1;
              if ((char)cVar1 < (char)this[uVar3 - 2]) {
                uVar11 = -uVar3;
              }
            }
            if (uVar10 == (int)(char)cVar1) {
              local_80 = (BitmapArray<long> *)&local_80[-1].field_0x27;
              lVar14 = *(long *)T;
              puVar8 = (undefined1 *)local_80;
              goto LAB_0010574b;
            }
            if (-1 < (int)uVar10) {
              bucket_A[lVar2 + (ulong)uVar10] = (long)local_80 - (long)pBVar5;
            }
            local_80 = (BitmapArray<long> *)((long)pBVar5 + bucket_A[lVar2 + uVar13] + -1);
            (**(code **)(*(long *)T + 0x20))(T,local_80,uVar11);
          }
          uVar10 = (uint)uVar13;
          bVar15 = puVar9 < puVar6;
          puVar6 = puVar6 + -1;
        } while (bVar15);
      }
      bVar15 = 0 < (long)uVar12;
      uVar12 = uVar12 - 1;
    } while (bVar15);
  }
  uVar12 = (ulong)(char)(this + -1)[(long)bucket_B];
  lVar14 = (long)&(pBVar5->super_Bitmap)._vptr_Bitmap + *(long *)(pVar4 + uVar12 * 8) + 1;
  (**(code **)(*(long *)T + 0x20))(T,lVar14,(long)bucket_B + -1);
  pBVar7 = pBVar5;
  if (pBVar5 < (BitmapArray<long> *)((long)&(pBVar5->super_Bitmap)._vptr_Bitmap + (long)bucket_B)) {
    do {
      uVar3 = (**(code **)(*(long *)T + 0x28))(T,pBVar7);
      if ((long)uVar3 < 0) {
        (**(code **)(*(long *)T + 0x20))(T,pBVar7,~uVar3);
      }
      else if (uVar3 != 0) {
        cVar1 = this[uVar3 - 1];
        uVar10 = (uint)(char)cVar1;
        if ((char)this[uVar3] <= (char)cVar1) {
          if (uVar3 == 1) {
            lVar2 = 0;
          }
          else {
            lVar2 = uVar3 - 1;
            if ((char)this[uVar3 - 2] < (char)cVar1) {
              lVar2 = -uVar3;
            }
          }
          if ((uint)uVar12 == uVar10) {
            lVar14 = lVar14 + 1;
            (**(code **)(*(long *)T + 0x20))(T,lVar14);
          }
          else {
            *(long *)(pVar4 + (long)(int)(uint)uVar12 * 8) = lVar14 - (long)pBVar5;
            lVar14 = (long)&(pBVar5->super_Bitmap)._vptr_Bitmap +
                     *(long *)(pVar4 + (long)(int)uVar10 * 8) + 1;
            (**(code **)(*(long *)T + 0x20))(T,lVar14,lVar2);
            uVar12 = (ulong)uVar10;
          }
        }
      }
      bucket_B = (long *)((long)bucket_B + -1);
      pBVar7 = (BitmapArray<long> *)((long)&(pBVar7->super_Bitmap)._vptr_Bitmap + 1);
    } while (bucket_B != (long *)0x0);
  }
  return;
}

Assistant:

void constructSA_from_typeBstar(const StringIterator_type T, SAIterator_type SA,
                                pos_type *bucket_A, pos_type *bucket_B,
                                pos_type n, pos_type m,
                                alphabetsize_type alphabetsize) {
  SAIterator_type i, j, t = SA;
  pos_type s;
  alphabetsize_type c0, c1, c2;

  /** An implementation version of MSufSort3's second stage. **/

  if (0 < m) {
    /* Construct the sorted order of type B suffixes by using
     the sorted order of type B* suffixes. */
    for (c1 = alphabetsize - 2; 0 <= c1; --c1) {
      /* Scan the suffix array from right to left. */
      for (i = SA + BUCKET_BSTAR(c1, c1 + 1), j = SA + (BUCKET_A(c1 + 1)+ 1),
      c2 = -1;
      i < j;) {
        if(0 <= (s = *--j)) {
          if((0 <= --s) && ((c0 = T[s]) <= c1)) {
            *j = ~(s + 1);
            if((0 < s) && (T[s - 1] > c0)) {s = ~s;}
            if(c2 == c0) {*--t = s;}
            else {
              if(0 <= c2) {BUCKET_B(c2, c1) = t - SA;}
              *(t = SA + BUCKET_B(c2 = c0, c1) - 1) = s;
            }
          }
        } else {
          *j = ~s;
        }
      }
    }
  }

  /* Construct the suffix array by using
   the sorted order of type B suffixes. */
  *(t = SA + (BUCKET_A(c2 = T[n - 1])+ 1)) = n - 1;
  /* Scan the suffix array from left to right. */
  for (i = SA, j = SA + n; i < j; ++i) {
    if (0 <= (s = *i)) {
      if ((0 <= --s) && ((c0 = T[s]) >= T[s + 1])) {
        if ((0 < s) && (T[s - 1] < c0)) {
          s = ~s;
        }
        if (c0 == c2) {
          *++t = s;
        } else {
          BUCKET_A(c2)= t - SA;
          *(t = SA + (BUCKET_A(c2 = c0) + 1)) = s;
        }
      }
    } else {
      *i = ~s;
    }
  }
}